

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void __thiscall PingPong::~PingPong(PingPong *this)

{
  PingPong *this_local;
  
  actorpp::Channel<int>::~Channel(&this->pong);
  actorpp::Channel<bool>::~Channel(&this->do_exit);
  actorpp::Channel<int>::~Channel(&this->ping);
  actorpp::Actor::~Actor(&this->super_Actor);
  return;
}

Assistant:

PingPong(Channel<int> pong) : ping(*this), do_exit(*this), pong(pong) {}